

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiPayload * ImGui::AcceptDragDropPayload(char *type,ImGuiDragDropFlags flags)

{
  ImGuiPayload *this;
  ImGuiID IVar1;
  ImGuiID IVar2;
  ImDrawList *this_00;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ImVec2 IVar6;
  undefined1 auVar7 [12];
  ImGuiContext *pIVar8;
  ImGuiWindow *pIVar9;
  bool bVar10;
  ImU32 col;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ImRect local_48;
  ImGuiWindow *local_38;
  
  pIVar8 = GImGui;
  local_38 = GImGui->CurrentWindow;
  this = &GImGui->DragDropPayload;
  if ((type == (char *)0x0) || (bVar10 = ImGuiPayload::IsDataType(this,type), bVar10)) {
    pIVar9 = local_38;
    IVar6 = (pIVar8->DragDropTargetRect).Max;
    auVar7._0_4_ = (pIVar8->DragDropTargetRect).Min.x;
    auVar7._4_4_ = (pIVar8->DragDropTargetRect).Min.y;
    auVar7._8_4_ = (pIVar8->DragDropTargetRect).Max.x;
    IVar1 = pIVar8->DragDropTargetId;
    IVar2 = pIVar8->DragDropAcceptIdPrev;
    local_48.Max.y = IVar6.y;
    auVar11._12_4_ = local_48.Max.y;
    auVar11._0_12_ = auVar7;
    auVar12._8_4_ = IVar6.x;
    auVar12._12_4_ = IVar6.y;
    auVar12._0_4_ = IVar6.x;
    auVar12._4_4_ = IVar6.y;
    auVar12 = vsubps_avx(auVar12,auVar11);
    auVar11 = vmovshdup_avx(auVar12);
    fVar3 = auVar12._0_4_ * auVar11._0_4_;
    if (fVar3 < pIVar8->DragDropAcceptIdCurrRectSurface) {
      pIVar8->DragDropAcceptFlags = flags;
      pIVar8->DragDropAcceptIdCurr = IVar1;
      pIVar8->DragDropAcceptIdCurrRectSurface = fVar3;
    }
    (pIVar8->DragDropPayload).Preview = IVar2 == IVar1;
    if (((pIVar8->DragDropSourceFlags | flags) & 0x800U) == 0 && IVar2 == IVar1) {
      local_48.Min.x = (float)auVar7._0_4_ + -3.5;
      local_48.Min.y = (float)auVar7._4_4_ + -3.5;
      local_48.Max.x = (float)auVar7._8_4_ + 3.5;
      local_48.Max.y = local_48.Max.y + 3.5;
      bVar10 = ImRect::Contains(&local_38->ClipRect,&local_48);
      if (!bVar10) {
        auVar13._4_4_ = local_48.Min.y;
        auVar13._0_4_ = local_48.Min.x;
        auVar13._8_8_ = 0;
        auVar14._4_4_ = local_48.Max.y;
        auVar14._0_4_ = local_48.Max.x;
        auVar14._8_8_ = 0;
        auVar4._8_4_ = 0xbf800000;
        auVar4._0_8_ = 0xbf800000bf800000;
        auVar4._12_4_ = 0xbf800000;
        auVar11 = vaddps_avx512vl(auVar13,auVar4);
        auVar5._8_4_ = 0x3f800000;
        auVar5._0_8_ = 0x3f8000003f800000;
        auVar5._12_4_ = 0x3f800000;
        auVar12 = vaddps_avx512vl(auVar14,auVar5);
        ImDrawList::PushClipRect(pIVar9->DrawList,auVar11._0_8_,auVar12._0_8_,false);
      }
      this_00 = pIVar9->DrawList;
      col = GetColorU32(0x2b,1.0);
      ImDrawList::AddRect(this_00,&local_48.Min,&local_48.Max,col,0.0,-1,2.0);
      if (!bVar10) {
        ImDrawList::PopClipRect(local_38->DrawList);
      }
    }
    pIVar8->DragDropAcceptFrameCount = pIVar8->FrameCount;
    if (IVar2 == IVar1) {
      bVar10 = (GImGui->IO).MouseDown[pIVar8->DragDropMouseButton];
      (pIVar8->DragDropPayload).Delivery = (bool)(bVar10 ^ 1);
      if (((uint)flags >> 10 & 1) != 0) {
        return this;
      }
      if (bVar10 == false) {
        return this;
      }
    }
    else {
      (pIVar8->DragDropPayload).Delivery = false;
      if (((uint)flags >> 10 & 1) != 0) {
        return this;
      }
    }
  }
  return (ImGuiPayload *)0x0;
}

Assistant:

const ImGuiPayload* ImGui::AcceptDragDropPayload(const char* type, ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiPayload& payload = g.DragDropPayload;
    IM_ASSERT(g.DragDropActive);                        // Not called between BeginDragDropTarget() and EndDragDropTarget() ?
    IM_ASSERT(payload.DataFrameCount != -1);            // Forgot to call EndDragDropTarget() ?
    if (type != NULL && !payload.IsDataType(type))
        return NULL;

    // Accept smallest drag target bounding box, this allows us to nest drag targets conveniently without ordering constraints.
    // NB: We currently accept NULL id as target. However, overlapping targets requires a unique ID to function!
    const bool was_accepted_previously = (g.DragDropAcceptIdPrev == g.DragDropTargetId);
    ImRect r = g.DragDropTargetRect;
    float r_surface = r.GetWidth() * r.GetHeight();
    if (r_surface < g.DragDropAcceptIdCurrRectSurface)
    {
        g.DragDropAcceptFlags = flags;
        g.DragDropAcceptIdCurr = g.DragDropTargetId;
        g.DragDropAcceptIdCurrRectSurface = r_surface;
    }

    // Render default drop visuals
    payload.Preview = was_accepted_previously;
    flags |= (g.DragDropSourceFlags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect); // Source can also inhibit the preview (useful for external sources that lives for 1 frame)
    if (!(flags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect) && payload.Preview)
    {
        // FIXME-DRAG: Settle on a proper default visuals for drop target.
        r.Expand(3.5f);
        bool push_clip_rect = !window->ClipRect.Contains(r);
        if (push_clip_rect) window->DrawList->PushClipRect(r.Min-ImVec2(1,1), r.Max+ImVec2(1,1));
        window->DrawList->AddRect(r.Min, r.Max, GetColorU32(ImGuiCol_DragDropTarget), 0.0f, ~0, 2.0f);
        if (push_clip_rect) window->DrawList->PopClipRect();
    }

    g.DragDropAcceptFrameCount = g.FrameCount;
    payload.Delivery = was_accepted_previously && !IsMouseDown(g.DragDropMouseButton); // For extern drag sources affecting os window focus, it's easier to just test !IsMouseDown() instead of IsMouseReleased()
    if (!payload.Delivery && !(flags & ImGuiDragDropFlags_AcceptBeforeDelivery))
        return NULL;

    return &payload;
}